

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c
# Opt level: O1

void update_miscstats(void)

{
  MISCSTATS *pMVar1;
  timeval timev;
  rusage ru;
  timeval local_b0;
  rusage local_a0;
  
  getrusage(RUSAGE_SELF,&local_a0);
  MiscStats->totaltime =
       ((int)(SUB168(SEXT816(0x20c49ba5e353f7cf) * SEXT816(local_a0.ru_utime.tv_usec),8) >> 7) -
       (SUB164(SEXT816(0x20c49ba5e353f7cf) * SEXT816(local_a0.ru_utime.tv_usec),0xc) >> 0x1f)) +
       (int)local_a0.ru_utime.tv_sec * 1000;
  pMVar1 = MiscStats;
  MiscStats->swapwaittime =
       ((int)(SUB168(SEXT816(0x20c49ba5e353f7cf) * SEXT816(local_a0.ru_stime.tv_usec),8) >> 7) -
       (SUB164(SEXT816(0x20c49ba5e353f7cf) * SEXT816(local_a0.ru_stime.tv_usec),0xc) >> 0x1f)) +
       (int)local_a0.ru_stime.tv_sec * 1000;
  pMVar1->pagefaults = (int)local_a0.ru_majflt + (int)local_a0.ru_minflt;
  pMVar1->swapwrites = (int)local_a0.ru_majflt;
  pMVar1->diskiotime = 0;
  pMVar1->diskops = (int)local_a0.ru_oublock + (int)local_a0.ru_inblock;
  gettimeofday(&local_b0,(__timezone_ptr_t)0x0);
  pMVar1 = MiscStats;
  MiscStats->secondsclock = (int)local_b0.tv_sec + 0x81c94b00U;
  pMVar1->secondstmp = (int)local_b0.tv_sec + 0x81c94b00U;
  return;
}

Assistant:

void update_miscstats(void) {
#ifdef DOS
  struct dostime_t dtm; /* holds DOS time, so we can get .01 secs */
  _dos_gettime(&dtm);

  MiscStats->totaltime = (time(0) * 1000) + (10 * dtm.hsecond);
  MiscStats->swapwaittime = 0;
  MiscStats->pagefaults = 0;
  MiscStats->swapwrites = 0;
  MiscStats->diskiotime = 0; /* ?? not available ?? */
  MiscStats->diskops = 0;
  MiscStats->secondstmp = MiscStats->secondsclock = (time(0) + UNIX_ALTO_TIME_DIFF);
#elif defined(MAIKO_OS_EMSCRIPTEN)
  /* Emscripten does not provide getrusage() functionality */
  struct timeval timev;

  MiscStats->totaltime = gettime(0) - MiscStats->starttime;
  MiscStats->swapwaittime = 0;
  MiscStats->pagefaults = 0;
  MiscStats->swapwrites = 0;
  MiscStats->diskiotime = 0;
  MiscStats->diskops = 0;

  gettimeofday(&timev, NULL);
  MiscStats->secondstmp = MiscStats->secondsclock = (timev.tv_sec + UNIX_ALTO_TIME_DIFF);
#else
  struct timeval timev;
  struct rusage ru;

  getrusage(RUSAGE_SELF, &ru);

  MiscStats->totaltime = ru.ru_utime.tv_sec * 1000 + ru.ru_utime.tv_usec / 1000;
  MiscStats->swapwaittime = ru.ru_stime.tv_sec * 1000 + ru.ru_stime.tv_usec / 1000;
  MiscStats->pagefaults = ru.ru_minflt + ru.ru_majflt;
  MiscStats->swapwrites = ru.ru_majflt;
  MiscStats->diskiotime = 0; /* ?? not available ?? */
  MiscStats->diskops = ru.ru_inblock + ru.ru_oublock;
  gettimeofday(&timev, NULL);
  MiscStats->secondstmp = MiscStats->secondsclock = (timev.tv_sec + UNIX_ALTO_TIME_DIFF);
#endif /* DOS */
}